

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void yprp_grouping(lys_ypr_ctx_conflict *pctx,lysp_node_grp *grp)

{
  uint16_t *puVar1;
  int8_t *flag_00;
  lysp_ext_instance *plVar2;
  lysp_node_grp *grp_00;
  lysp_node *node;
  lysp_node_action *action;
  lysp_node_notif *notif;
  char flag_01;
  ulong in_RAX;
  lysp_ext_instance *plVar3;
  ulong uVar4;
  lysp_ext_instance *ext;
  long lVar5;
  uint64_t u;
  lysp_ext_instance *plVar6;
  ulong uVar7;
  bool bVar8;
  int8_t flag;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  plVar6 = (lysp_ext_instance *)0x0;
  ypr_open(pctx,"grouping","name",(grp->field_0).node.name,'\0');
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  plVar2 = (grp->field_0).node.exts;
  ext = plVar2;
  while( true ) {
    if (plVar2 == (lysp_ext_instance *)0x0) {
      plVar3 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar3 = plVar2[-1].exts;
    }
    if (plVar3 <= plVar6) break;
    yprp_extension_instance(pctx,LY_STMT_GROUPING,'\0',ext,(int8_t *)((long)&uStack_38 + 7));
    plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
    ext = ext + 1;
  }
  flag_00 = (int8_t *)((long)&uStack_38 + 7);
  ypr_status(pctx,(grp->field_0).node.flags,(grp->field_0).node.exts,flag_00);
  ypr_description(pctx,(grp->field_0).node.dsc,(grp->field_0).node.exts,flag_00);
  ypr_reference(pctx,(grp->field_0).node.ref,(grp->field_0).node.exts,flag_00);
  lVar5 = 0;
  uVar7 = 0;
  while( true ) {
    if (grp->typedefs == (lysp_tpdf *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ulong *)&grp->typedefs[-1].flags;
    }
    if (uVar4 <= uVar7) break;
    if (uStack_38._7_1_ == '\0') {
      uStack_38 = CONCAT17(1,(undefined7)uStack_38);
      ly_print_((pctx->field_0).field_0.out,">\n");
    }
    yprp_typedef(pctx,(lysp_tpdf *)((long)&grp->typedefs->name + lVar5));
    uVar7 = uVar7 + 1;
    lVar5 = lVar5 + 0xb0;
  }
  uVar7 = uStack_38;
  for (grp_00 = grp->groupings; grp_00 != (lysp_node_grp *)0x0;
      grp_00 = (grp_00->field_0).field_1.next) {
    uStack_38._7_1_ = (char)(uVar7 >> 0x38);
    bVar8 = uStack_38._7_1_ == '\0';
    uStack_38 = uVar7;
    if (bVar8) {
      uStack_38._0_7_ = (undefined7)uVar7;
      uStack_38 = CONCAT17(1,(undefined7)uStack_38);
      ly_print_((pctx->field_0).field_0.out,">\n");
    }
    yprp_grouping(pctx,grp_00);
    uVar7 = uStack_38;
  }
  for (node = grp->child; node != (lysp_node *)0x0; node = node->next) {
    uStack_38._7_1_ = (char)(uVar7 >> 0x38);
    bVar8 = uStack_38._7_1_ == '\0';
    uStack_38 = uVar7;
    if (bVar8) {
      uStack_38._0_7_ = (undefined7)uVar7;
      uStack_38 = CONCAT17(1,(undefined7)uStack_38);
      ly_print_((pctx->field_0).field_0.out,">\n");
    }
    yprp_node(pctx,node);
    uVar7 = uStack_38;
  }
  for (action = grp->actions; action != (lysp_node_action *)0x0;
      action = (action->field_0).field_1.next) {
    uStack_38._7_1_ = (char)(uVar7 >> 0x38);
    bVar8 = uStack_38._7_1_ == '\0';
    uStack_38 = uVar7;
    if (bVar8) {
      uStack_38._0_7_ = (undefined7)uVar7;
      uStack_38 = CONCAT17(1,(undefined7)uStack_38);
      ly_print_((pctx->field_0).field_0.out,">\n");
    }
    yprp_action(pctx,action);
    uVar7 = uStack_38;
  }
  for (notif = grp->notifs; uStack_38._7_1_ = (char)(uVar7 >> 0x38), flag_01 = uStack_38._7_1_,
      uStack_38 = uVar7, notif != (lysp_node_notif *)0x0; notif = (notif->field_0).field_1.next) {
    bVar8 = uStack_38._7_1_ == '\0';
    if (bVar8) {
      uStack_38._0_7_ = (undefined7)uVar7;
      uStack_38 = CONCAT17(1,(undefined7)uStack_38);
      ly_print_((pctx->field_0).field_0.out,">\n");
    }
    yprp_notification(pctx,notif);
    uVar7 = uStack_38;
  }
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 - 1;
  ypr_close(pctx,"grouping",flag_01);
  return;
}

Assistant:

static void
yprp_grouping(struct lys_ypr_ctx *pctx, const struct lysp_node_grp *grp)
{
    LY_ARRAY_COUNT_TYPE u;
    ly_bool flag = 0;
    struct lysp_node *data;
    struct lysp_node_action *action;
    struct lysp_node_notif *notif;
    struct lysp_node_grp *subgrp;

    ly_print_(pctx->out, "%*sgrouping %s", INDENT, grp->name);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_GROUPING, 0, grp->exts, &flag);
    ypr_status(pctx, grp->flags, grp->exts, &flag);
    ypr_description(pctx, grp->dsc, grp->exts, &flag);
    ypr_reference(pctx, grp->ref, grp->exts, &flag);

    LY_ARRAY_FOR(grp->typedefs, u) {
        ypr_open(pctx->out, &flag);
        yprp_typedef(pctx, &grp->typedefs[u]);
    }

    LY_LIST_FOR(grp->groupings, subgrp) {
        ypr_open(pctx->out, &flag);
        yprp_grouping(pctx, subgrp);
    }

    LY_LIST_FOR(grp->child, data) {
        ypr_open(pctx->out, &flag);
        yprp_node(pctx, data);
    }

    LY_LIST_FOR(grp->actions, action) {
        ypr_open(pctx->out, &flag);
        yprp_action(pctx, action);
    }

    LY_LIST_FOR(grp->notifs, notif) {
        ypr_open(pctx->out, &flag);
        yprp_notification(pctx, notif);
    }

    LEVEL--;
    ypr_close(pctx, flag);
}